

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_get_format_values(bcf_hdr_t *hdr,bcf1_t *line,char *tag,void **dst,int *ndst,int type)

{
  char cVar1;
  short sVar2;
  uint uVar3;
  uint32_t uVar4;
  bcf_fmt_t *pbVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  void *pvVar9;
  uint32_t *puVar10;
  int *piVar11;
  int iVar12;
  uint32_t uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  size_t __size;
  long lVar20;
  anon_union_4_2_947300a4 u;
  
  uVar8 = bcf_hdr_id2int(hdr,0,tag);
  iVar19 = -1;
  if ((-1 < (int)uVar8) && (uVar3 = (hdr->id[0][uVar8].val)->info[2], (~uVar3 & 0xf) != 0)) {
    if ((*tag == 'G') && ((tag[1] == 'T' && (tag[2] == '\0')))) {
      if ((uVar3 & 0xf0) != 0x30) {
        return -2;
      }
    }
    else if ((uVar3 >> 4 & 0xf) != type) {
      return -2;
    }
    if ((line->unpacked & 8) == 0) {
      bcf_unpack(line,8);
    }
    iVar19 = -3;
    for (lVar20 = 0; (ulong)(byte)line->field_0x14 * 0x20 != lVar20; lVar20 = lVar20 + 0x20) {
      if (*(uint *)((long)&((line->d).fmt)->id + lVar20) == uVar8) {
        if ((uint)(byte)line->field_0x14 << 5 == (int)lVar20) {
          return -3;
        }
        pbVar5 = (line->d).fmt;
        if (type == 3) {
          __size = (long)hdr->n[2] * (long)*(int *)((long)&pbVar5->n + lVar20);
          pvVar9 = *dst;
          iVar19 = (int)__size;
          if (*ndst < iVar19) {
            pvVar9 = realloc(pvVar9,__size);
            *dst = pvVar9;
            if (pvVar9 == (void *)0x0) {
              return -4;
            }
            *ndst = iVar19;
          }
          memcpy(pvVar9,*(void **)((long)&pbVar5->p + lVar20),__size);
          return iVar19;
        }
        iVar19 = hdr->n[2];
        lVar15 = (long)*(int *)((long)&pbVar5->n + lVar20) * (long)iVar19;
        iVar12 = (int)lVar15;
        if (*ndst < iVar12) {
          *ndst = iVar12;
          pvVar9 = realloc(*dst,lVar15 * 4);
          *dst = pvVar9;
        }
        switch(*(undefined4 *)((long)&pbVar5->type + lVar20)) {
        case 1:
          piVar11 = (int *)*dst;
          lVar15 = *(long *)((long)&pbVar5->p + lVar20);
          iVar12 = 0;
          iVar14 = 0;
          if (0 < iVar19) {
            iVar12 = 0;
            iVar14 = iVar19;
          }
          for (; iVar12 != iVar14; iVar12 = iVar12 + 1) {
            for (uVar16 = 0; (long)uVar16 < (long)*(int *)((long)&pbVar5->n + lVar20);
                uVar16 = uVar16 + 1) {
              cVar1 = *(char *)(lVar15 + uVar16);
              iVar17 = -0x80000000;
              if (cVar1 != -0x80) {
                if (cVar1 == -0x7f) {
                  *piVar11 = -0x7fffffff;
                  break;
                }
                iVar17 = (int)cVar1;
              }
              *piVar11 = iVar17;
              piVar11 = piVar11 + 1;
            }
            for (; (int)uVar16 < *(int *)((long)&pbVar5->n + lVar20);
                uVar16 = (ulong)((int)uVar16 + 1)) {
              *piVar11 = -0x7fffffff;
              piVar11 = piVar11 + 1;
            }
            lVar15 = lVar15 + *(int *)((long)&pbVar5->size + lVar20);
          }
          break;
        case 2:
          piVar11 = (int *)*dst;
          lVar15 = *(long *)((long)&pbVar5->p + lVar20);
          iVar12 = 0;
          iVar14 = 0;
          if (0 < iVar19) {
            iVar12 = 0;
            iVar14 = iVar19;
          }
          for (; iVar12 != iVar14; iVar12 = iVar12 + 1) {
            for (uVar16 = 0; (long)uVar16 < (long)*(int *)((long)&pbVar5->n + lVar20);
                uVar16 = uVar16 + 1) {
              sVar2 = *(short *)(lVar15 + uVar16 * 2);
              iVar17 = -0x80000000;
              if (sVar2 != -0x8000) {
                if (sVar2 == -0x7fff) {
                  *piVar11 = -0x7fffffff;
                  break;
                }
                iVar17 = (int)sVar2;
              }
              *piVar11 = iVar17;
              piVar11 = piVar11 + 1;
            }
            for (; (int)uVar16 < *(int *)((long)&pbVar5->n + lVar20);
                uVar16 = (ulong)((int)uVar16 + 1)) {
              *piVar11 = -0x7fffffff;
              piVar11 = piVar11 + 1;
            }
            lVar15 = lVar15 + *(int *)((long)&pbVar5->size + lVar20);
          }
          break;
        case 3:
          piVar11 = (int *)*dst;
          lVar15 = *(long *)((long)&pbVar5->p + lVar20);
          iVar12 = 0;
          iVar14 = 0;
          if (0 < iVar19) {
            iVar12 = 0;
            iVar14 = iVar19;
          }
          for (; iVar12 != iVar14; iVar12 = iVar12 + 1) {
            for (uVar16 = 0; (long)uVar16 < (long)*(int *)((long)&pbVar5->n + lVar20);
                uVar16 = uVar16 + 1) {
              iVar17 = *(int *)(lVar15 + uVar16 * 4);
              if (iVar17 == -0x7fffffff) {
                *piVar11 = -0x7fffffff;
                break;
              }
              *piVar11 = iVar17;
              piVar11 = piVar11 + 1;
            }
            for (; (int)uVar16 < *(int *)((long)&pbVar5->n + lVar20);
                uVar16 = (ulong)((int)uVar16 + 1)) {
              *piVar11 = -0x7fffffff;
              piVar11 = piVar11 + 1;
            }
            lVar15 = lVar15 + *(int *)((long)&pbVar5->size + lVar20);
          }
          break;
        default:
          fprintf(_stderr,"TODO: %s:%d .. fmt->type=%d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                  ,0xc87);
          exit(1);
        case 5:
          puVar10 = (uint32_t *)*dst;
          lVar15 = *(long *)((long)&pbVar5->p + lVar20);
          iVar12 = 0;
          iVar14 = 0;
          if (0 < iVar19) {
            iVar12 = 0;
            iVar14 = iVar19;
          }
          for (; uVar7 = bcf_float_vector_end, uVar6 = bcf_float_missing, iVar12 != iVar14;
              iVar12 = iVar12 + 1) {
            uVar8 = *(uint *)((long)&pbVar5->n + lVar20);
            uVar16 = 0;
            if (0 < (int)uVar8) {
              uVar16 = (ulong)uVar8;
            }
            for (uVar18 = 0; uVar4 = bcf_float_vector_end, uVar16 != uVar18; uVar18 = uVar18 + 1) {
              uVar4 = *(uint32_t *)(lVar15 + uVar18 * 4);
              uVar13 = uVar6;
              if ((uVar6 != uVar4) && (uVar13 = uVar4, uVar7 == uVar4)) {
                *puVar10 = uVar7;
                uVar16 = uVar18 & 0xffffffff;
                uVar4 = bcf_float_vector_end;
                break;
              }
              *puVar10 = uVar13;
              puVar10 = puVar10 + 1;
            }
            for (; (int)uVar16 < (int)uVar8; uVar16 = (ulong)((int)uVar16 + 1)) {
              *puVar10 = uVar4;
              puVar10 = puVar10 + 1;
            }
            lVar15 = lVar15 + *(int *)((long)&pbVar5->size + lVar20);
          }
        }
        return iVar19 * *(int *)((long)&pbVar5->n + lVar20);
      }
    }
  }
  return iVar19;
}

Assistant:

int bcf_get_format_values(const bcf_hdr_t *hdr, bcf1_t *line, const char *tag, void **dst, int *ndst, int type)
{
    int i,j, tag_id = bcf_hdr_id2int(hdr, BCF_DT_ID, tag);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_FMT,tag_id) ) return -1;    // no such FORMAT field in the header
    if ( tag[0]=='G' && tag[1]=='T' && tag[2]==0 )
    {
        // Ugly: GT field is considered to be a string by the VCF header but BCF represents it as INT.
        if ( bcf_hdr_id2type(hdr,BCF_HL_FMT,tag_id)!=BCF_HT_STR ) return -2;
    }
    else if ( bcf_hdr_id2type(hdr,BCF_HL_FMT,tag_id)!=type ) return -2;     // expected different type

    if ( !(line->unpacked & BCF_UN_FMT) ) bcf_unpack(line, BCF_UN_FMT);

    for (i=0; i<line->n_fmt; i++)
        if ( line->d.fmt[i].id==tag_id ) break;
    if ( i==line->n_fmt ) return -3;                               // the tag is not present in this record
    bcf_fmt_t *fmt = &line->d.fmt[i];

    if ( type==BCF_HT_STR )
    {
        int n = fmt->n*bcf_hdr_nsamples(hdr);
        if ( *ndst < n )
        {
            *dst  = realloc(*dst, n);
            if ( !*dst ) return -4;     // could not alloc
            *ndst = n;
        }
        memcpy(*dst,fmt->p,n);
        return n;
    }

    // Make sure the buffer is big enough
    int nsmpl = bcf_hdr_nsamples(hdr);
    int size1 = type==BCF_HT_INT ? sizeof(int32_t) : sizeof(float);
    if ( *ndst < fmt->n*nsmpl )
    {
        *ndst = fmt->n*nsmpl;
        *dst  = realloc(*dst, *ndst*size1);
        if ( !dst ) return -4;     // could not alloc
    }

    #define BRANCH(type_t, is_missing, is_vector_end, set_missing, set_vector_end, out_type_t) { \
        out_type_t *tmp = (out_type_t *) *dst; \
        type_t *p = (type_t*) fmt->p; \
        for (i=0; i<nsmpl; i++) \
        { \
            for (j=0; j<fmt->n; j++) \
            { \
                if ( is_missing ) set_missing; \
                else if ( is_vector_end ) { set_vector_end; break; } \
                else *tmp = p[j]; \
                tmp++; \
            } \
            for (; j<fmt->n; j++) { set_vector_end; tmp++; } \
            p = (type_t *)((char *)p + fmt->size); \
        } \
    }
    switch (fmt->type) {
        case BCF_BT_INT8:  BRANCH(int8_t,  p[j]==bcf_int8_missing,  p[j]==bcf_int8_vector_end,  *tmp=bcf_int32_missing, *tmp=bcf_int32_vector_end, int32_t); break;
        case BCF_BT_INT16: BRANCH(int16_t, p[j]==bcf_int16_missing, p[j]==bcf_int16_vector_end, *tmp=bcf_int32_missing, *tmp=bcf_int32_vector_end, int32_t); break;
        case BCF_BT_INT32: BRANCH(int32_t, p[j]==bcf_int32_missing, p[j]==bcf_int32_vector_end, *tmp=bcf_int32_missing, *tmp=bcf_int32_vector_end, int32_t); break;
        case BCF_BT_FLOAT: BRANCH(float,   bcf_float_is_missing(p[j]), bcf_float_is_vector_end(p[j]), bcf_float_set_missing(*tmp), bcf_float_set_vector_end(*tmp), float); break;
        default: fprintf(stderr,"TODO: %s:%d .. fmt->type=%d\n", __FILE__,__LINE__, fmt->type); exit(1);
    }
    #undef BRANCH
    return nsmpl*fmt->n;
}